

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O0

int IDAQuadSensEwtSet(IDAMem IDA_mem,N_Vector *yQScur,N_Vector *weightQS)

{
  int iVar1;
  N_Vector *in_RDX;
  N_Vector *in_RSI;
  IDAMem in_RDI;
  int flag;
  int local_1c;
  
  local_1c = 0;
  iVar1 = in_RDI->ida_itolQS;
  if (iVar1 == 1) {
    local_1c = IDAQuadSensEwtSetSS(in_RDI,in_RSI,in_RDX);
  }
  else if (iVar1 == 2) {
    local_1c = IDAQuadSensEwtSetSV(in_RDI,in_RSI,in_RDX);
  }
  else if (iVar1 == 4) {
    local_1c = IDAQuadSensEwtSetEE(in_RDI,in_RSI,in_RDX);
  }
  return local_1c;
}

Assistant:

int IDAQuadSensEwtSet(IDAMem IDA_mem, N_Vector* yQScur, N_Vector* weightQS)
{
  int flag = 0;

  switch (IDA_mem->ida_itolQS)
  {
  case IDA_EE: flag = IDAQuadSensEwtSetEE(IDA_mem, yQScur, weightQS); break;
  case IDA_SS: flag = IDAQuadSensEwtSetSS(IDA_mem, yQScur, weightQS); break;
  case IDA_SV: flag = IDAQuadSensEwtSetSV(IDA_mem, yQScur, weightQS); break;
  }

  return (flag);
}